

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pliocomp.c
# Opt level: O1

int pl_p2li(int *pxsrc,int xs,short *lldst,int npix)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  short *psVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ushort *puVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  short sVar21;
  
  if (npix < 1) {
    return 0;
  }
  lldst[2] = -100;
  lldst[0] = 0;
  lldst[1] = 7;
  lldst[5] = 0;
  lldst[6] = 0;
  iVar6 = npix + xs;
  lVar16 = (long)xs;
  uVar5 = (ulong)(uint)pxsrc[lVar16 + -1];
  if (pxsrc[lVar16 + -1] < 1) {
    uVar5 = 0;
  }
  iVar7 = npix + -1 + xs;
  iVar9 = xs + 0x1000;
  uVar19 = 1;
  iVar10 = 8;
  uVar20 = 0;
  iVar13 = xs;
  do {
    uVar4 = (uint)uVar5;
    iVar15 = (int)lVar16;
    if (lVar16 < iVar7) {
      uVar18 = pxsrc[lVar16];
      if (pxsrc[lVar16] < 1) {
        uVar18 = 0;
      }
      uVar20 = (ulong)uVar18;
      if (uVar18 != uVar4) {
        if (uVar4 != 0) goto LAB_00192f08;
        goto LAB_0019304a;
      }
    }
    else {
      if (uVar4 == 0) {
        iVar13 = iVar6;
      }
LAB_00192f08:
      iVar17 = iVar13 - xs;
      if (((int)uVar4 < 1) || (uVar18 = uVar4 - uVar19, uVar18 == 0)) {
LAB_00192f9a:
        if (0 < iVar17) {
          psVar8 = lldst + (long)iVar10 + -1;
          lVar11 = (long)iVar10 << 0x20;
          do {
            lVar11 = lVar11 + 0x100000000;
            iVar10 = iVar10 + 1;
            sVar21 = (short)iVar17;
            if (0xffe < iVar17) {
              sVar21 = 0xfff;
            }
            *psVar8 = sVar21;
            psVar8 = psVar8 + 1;
            bVar2 = 0xfff < iVar17;
            iVar17 = iVar17 + -0xfff;
          } while (bVar2);
          if ((0 < (int)uVar4) && (iVar13 == iVar15)) {
            psVar8 = (short *)((long)lldst + (lVar11 >> 0x1f) + -4);
            *psVar8 = *psVar8 + 0x5001;
            goto LAB_0019303f;
          }
        }
        iVar17 = (iVar15 - iVar13) + 1;
        if (0 < iVar17) {
          puVar12 = (ushort *)(lldst + (long)iVar10 + -1);
          iVar13 = iVar9 - iVar13;
          do {
            iVar14 = 0xfff;
            if (iVar17 < 0xfff) {
              iVar14 = iVar17;
            }
            *puVar12 = (ushort)iVar14 | 0x4000;
            iVar17 = iVar17 + -0xfff;
            puVar12 = puVar12 + 1;
            iVar10 = iVar10 + 1;
            iVar13 = iVar13 + -0xfff;
          } while (0xfff < iVar13);
        }
      }
      else {
        uVar3 = -uVar18;
        if (0 < (int)uVar18) {
          uVar3 = uVar18;
        }
        lVar11 = (long)iVar10;
        uVar19 = uVar4;
        if (0xfff < uVar3) {
          lldst[lVar11 + -1] = (ushort)uVar5 & 0xfff | 0x1000;
          lldst[lVar11] = (short)(uVar5 >> 0xc);
          iVar10 = iVar10 + 2;
          goto LAB_00192f9a;
        }
        sVar21 = 0x3000 - (short)uVar18;
        if (-1 < (int)uVar18) {
          sVar21 = (short)uVar18 + 0x2000;
        }
        lldst[lVar11 + -1] = sVar21;
        iVar10 = iVar10 + 1;
        if ((iVar13 != iVar15) || (iVar17 != 0)) goto LAB_00192f9a;
        pbVar1 = (byte *)((long)lldst + lVar11 * 2 + -1);
        *pbVar1 = *pbVar1 | 0x40;
      }
LAB_0019303f:
      xs = iVar15 + 1;
LAB_0019304a:
      uVar5 = uVar20;
      iVar13 = iVar15 + 1;
      uVar20 = uVar5;
    }
    lVar16 = lVar16 + 1;
    iVar9 = iVar9 + 1;
    if (iVar6 <= lVar16) {
      iVar6 = iVar10 + -1;
      iVar7 = iVar10 + 0x7ffe;
      if (-1 < iVar6) {
        iVar7 = iVar6;
      }
      lldst[3] = ((short)iVar10 - ((ushort)iVar7 & 0x8000)) + -1;
      lldst[4] = (short)(iVar7 >> 0xf);
      return iVar6;
    }
  } while( true );
}

Assistant:

int pl_p2li (int *pxsrc, int xs, short *lldst, int npix)
/* int *pxsrc;                      input pixel array */
/* int xs;                          starting index in pxsrc (?) */
/* short *lldst;                    encoded line list */
/* int npix;                        number of pixels to convert */
{
    /* System generated locals */
    int ret_val, i__1, i__2, i__3;

    /* Local variables */
    int zero, v, x1, hi, ip, dv, xe, np, op, iz, nv = 0, pv, nz;

    /* Parameter adjustments */
    --lldst;
    --pxsrc;

    /* Function Body */
    if (! (npix <= 0)) {
        goto L110;
    }
    ret_val = 0;
    goto L100;
L110:
    lldst[3] = -100;
    lldst[2] = 7;
    lldst[1] = 0;
    lldst[6] = 0;
    lldst[7] = 0;
    xe = xs + npix - 1;
    op = 8;
    zero = 0;
/* Computing MAX */
    i__1 = zero, i__2 = pxsrc[xs];
    pv = max(i__1,i__2);
    x1 = xs;
    iz = xs;
    hi = 1;
    i__1 = xe;
    for (ip = xs; ip <= i__1; ++ip) {
        if (! (ip < xe)) {
            goto L130;
        }
/* Computing MAX */
        i__2 = zero, i__3 = pxsrc[ip + 1];
        nv = max(i__2,i__3);
        if (! (nv == pv)) {
            goto L140;
        }
        goto L120;
L140:
        if (! (pv == 0)) {
            goto L150;
        }
        pv = nv;
        x1 = ip + 1;
        goto L120;
L150:
        goto L131;
L130:
        if (! (pv == 0)) {
            goto L160;
        }
        x1 = xe + 1;
L160:
L131:
        np = ip - x1 + 1;
        nz = x1 - iz;
        if (! (pv > 0)) {
            goto L170;
        }
        dv = pv - hi;
        if (! (dv != 0)) {
            goto L180;
        }
        hi = pv;
        if (! (abs(dv) > 4095)) {
            goto L190;
        }
        lldst[op] = (short) ((pv & 4095) + 4096);
        ++op;
        lldst[op] = (short) (pv / 4096);
        ++op;
        goto L191;
L190:
        if (! (dv < 0)) {
            goto L200;
        }
        lldst[op] = (short) (-dv + 12288);
        goto L201;
L200:
        lldst[op] = (short) (dv + 8192);
L201:
        ++op;
        if (! (np == 1 && nz == 0)) {
            goto L210;
        }
        v = lldst[op - 1];
        lldst[op - 1] = (short) (v | 16384);
        goto L91;
L210:
L191:
L180:
L170:
        if (! (nz > 0)) {
            goto L220;
        }
L230:
        if (! (nz > 0)) {
            goto L232;
        }
        lldst[op] = (short) min(4095,nz);
        ++op;
/* L231: */
        nz += -4095;
        goto L230;
L232:
        if (! (np == 1 && pv > 0)) {
            goto L240;
        }
        lldst[op - 1] = (short) (lldst[op - 1] + 20481);
        goto L91;
L240:
L220:
L250:
        if (! (np > 0)) {
            goto L252;
        }
        lldst[op] = (short) (min(4095,np) + 16384);
        ++op;
/* L251: */
        np += -4095;
        goto L250;
L252:
L91:
        x1 = ip + 1;
        iz = x1;
        pv = nv;
L120:
        ;
    }
/* L121: */
    lldst[4] = (short) ((op - 1) % 32768);
    lldst[5] = (short) ((op - 1) / 32768);
    ret_val = op - 1;
    goto L100;
L100:
    return ret_val;
}